

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uscript.cpp
# Opt level: O0

int32_t setOneCode(UScriptCode script,UScriptCode *scripts,int32_t capacity,UErrorCode *err)

{
  UBool UVar1;
  UErrorCode *err_local;
  int32_t capacity_local;
  UScriptCode *scripts_local;
  UScriptCode script_local;
  
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    if (capacity < 1) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      scripts_local._4_4_ = 1;
    }
    else {
      *scripts = script;
      scripts_local._4_4_ = 1;
    }
  }
  else {
    scripts_local._4_4_ = 0;
  }
  return scripts_local._4_4_;
}

Assistant:

static int32_t
setOneCode(UScriptCode script, UScriptCode *scripts, int32_t capacity, UErrorCode *err) {
    if(U_FAILURE(*err)) { return 0; }
    if(1 > capacity) {
        *err = U_BUFFER_OVERFLOW_ERROR;
        return 1;
    }
    scripts[0] = script;
    return 1;
}